

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiDockNode * ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode *node,ImVec2 pos)

{
  float fVar1;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode *pIVar3;
  
  pIVar3 = (ImGuiDockNode *)0x0;
  while ((((pIVar2 = pIVar3, (node->field_0xbd & 2) != 0 && ((node->Pos).x <= pos.x)) &&
          (fVar1 = (node->Pos).y, fVar1 <= pos.y)) &&
         (((pIVar2 = (ImGuiDockNode *)0x0, pos.x < (node->Pos).x + (node->Size).x &&
           (pos.y < fVar1 + (node->Size).y)) &&
          ((pIVar2 = node, node->ChildNodes[0] != (ImGuiDockNode *)0x0 &&
           (pIVar2 = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0],pos),
           pIVar2 == (ImGuiDockNode *)0x0))))))) {
    node = node->ChildNodes[1];
  }
  return pIVar2;
}

Assistant:

ImGuiDockNode* ImGui::DockNodeTreeFindVisibleNodeByPos(ImGuiDockNode* node, ImVec2 pos)
{
    if (!node->IsVisible)
        return NULL;

    const float dock_spacing = 0.0f;// g.Style.ItemInnerSpacing.x; // FIXME: Relation to DOCKING_SPLITTER_SIZE?
    ImRect r(node->Pos, node->Pos + node->Size);
    r.Expand(dock_spacing * 0.5f);
    bool inside = r.Contains(pos);
    if (!inside)
        return NULL;

    if (node->IsLeafNode())
        return node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[0], pos))
        return hovered_node;
    if (ImGuiDockNode* hovered_node = DockNodeTreeFindVisibleNodeByPos(node->ChildNodes[1], pos))
        return hovered_node;

    return NULL;
}